

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<Assimp::FIBoolValue> __thiscall
Assimp::FIBoolValue::create(FIBoolValue *this,vector<bool,_std::allocator<bool>_> *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Assimp::FIBoolValue> sVar1;
  undefined1 local_29;
  FIValue local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28._vptr_FIValue = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Assimp::FIBoolValueImpl,std::allocator<Assimp::FIBoolValueImpl>,std::vector<bool,std::allocator<bool>>>
            (a_Stack_20,(FIBoolValueImpl **)&local_28,
             (allocator<Assimp::FIBoolValueImpl> *)&local_29,value);
  (this->super_FIValue)._vptr_FIValue = local_28._vptr_FIValue;
  (this->value).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p = (_Bit_type *)a_Stack_20[0]._M_pi;
  sVar1.super___shared_ptr<Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FIBoolValue>)
         sVar1.super___shared_ptr<Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FIBoolValue> FIBoolValue::create(std::vector<bool> &&value) {
    return std::make_shared<FIBoolValueImpl>(std::move(value));
}